

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_>::~ModeState
          (ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *this)

{
  void *pvVar1;
  long in_RDI;
  ColumnDataScanState *in_stack_ffffffffffffffe0;
  
  if ((*(long *)(in_RDI + 0x18) != 0) && (pvVar1 = *(void **)(in_RDI + 0x18), pvVar1 != (void *)0x0)
     ) {
    std::
    unordered_map<unsigned_long,_duckdb::ModeAttr,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ModeAttr>_>_>
    ::~unordered_map((unordered_map<unsigned_long,_duckdb::ModeAttr,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ModeAttr>_>_>
                      *)0xb1aac8);
    operator_delete(pvVar1);
  }
  if ((*(long *)(in_RDI + 0x20) != 0) &&
     (in_stack_ffffffffffffffe0 = *(ColumnDataScanState **)(in_RDI + 0x20),
     in_stack_ffffffffffffffe0 != (ColumnDataScanState *)0x0)) {
    operator_delete(in_stack_ffffffffffffffe0);
  }
  if ((*(long *)(in_RDI + 0x48) != 0) && (pvVar1 = *(void **)(in_RDI + 0x48), pvVar1 != (void *)0x0)
     ) {
    ColumnDataScanState::~ColumnDataScanState(in_stack_ffffffffffffffe0);
    operator_delete(pvVar1);
  }
  duckdb::DataChunk::~DataChunk((DataChunk *)(in_RDI + 0x50));
  vector<duckdb::FrameBounds,_true>::~vector((vector<duckdb::FrameBounds,_true> *)0xb1ab4b);
  return;
}

Assistant:

~ModeState() {
		if (frequency_map) {
			delete frequency_map;
		}
		if (mode) {
			delete mode;
		}
		if (scan) {
			delete scan;
		}
	}